

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O2

void opj_t1_clbl_decode_processor(void *user_data,opj_tls_t *tls)

{
  OPJ_UINT32 *pOVar1;
  int *piVar2;
  float *pfVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  opj_tcd_cblk_dec_t *cblk;
  opj_event_mgr_t *p_manager;
  opj_mutex_t *p_manager_mutex;
  opj_mqc_state_t *poVar7;
  uint *puVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  OPJ_BOOL OVar20;
  OPJ_BOOL OVar21;
  OPJ_INT32 *pOVar22;
  opj_t1_t *p_t1;
  long lVar23;
  OPJ_BYTE *pOVar24;
  uint *puVar25;
  byte bVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  uint uVar31;
  int iVar32;
  ulong uVar33;
  opj_flag_t *poVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  uint uVar40;
  int *piVar41;
  ulong uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  OPJ_UINT32 OVar49;
  int iVar50;
  int *piVar51;
  long lVar52;
  opj_mqc_state_t **ppoVar53;
  OPJ_BYTE *pOVar54;
  uint uVar55;
  uint uVar56;
  int iVar57;
  uint *puVar58;
  OPJ_UINT32 OVar59;
  uint uVar60;
  size_t size;
  int *piVar61;
  opj_tcd_seg_t *poVar62;
  opj_mqc_t *mqc;
  ulong uVar63;
  bool bVar64;
  bool bVar65;
  bool bVar66;
  float fVar67;
  uint local_ac;
  OPJ_BYTE *local_70;
  OPJ_INT32 *local_58;
  
  cblk = *(opj_tcd_cblk_dec_t **)((long)user_data + 8);
  if (*user_data == 0) {
    size = (ulong)(uint)(cblk->y1 - cblk->y0) * (ulong)(uint)(cblk->x1 - cblk->x0) * 4;
    pOVar22 = (OPJ_INT32 *)opj_aligned_malloc(size);
    cblk->decoded_data = pOVar22;
    if (pOVar22 != (OPJ_INT32 *)0x0) {
      memset(pOVar22,0,size);
      goto LAB_00129c5e;
    }
    if (*(opj_mutex_t **)((long)user_data + 0x40) != (opj_mutex_t *)0x0) {
      opj_mutex_lock(*(opj_mutex_t **)((long)user_data + 0x40));
    }
    opj_event_msg(*(opj_event_mgr_t **)((long)user_data + 0x38),1,
                  "Cannot allocate cblk->decoded_data\n");
    if (*(opj_mutex_t **)((long)user_data + 0x40) != (opj_mutex_t *)0x0) {
      opj_mutex_unlock(*(opj_mutex_t **)((long)user_data + 0x40));
    }
    goto LAB_0012a2d7;
  }
  if (cblk->decoded_data != (OPJ_INT32 *)0x0) {
    opj_aligned_free(cblk->decoded_data);
    cblk->decoded_data = (OPJ_INT32 *)0x0;
  }
LAB_00129c5e:
  iVar5 = *(int *)((long)user_data + 4);
  piVar51 = *(int **)((long)user_data + 0x10);
  lVar23 = *(long *)((long)user_data + 0x18);
  lVar52 = *(long *)((long)user_data + 0x20);
  lVar29 = (ulong)(*(int *)(lVar23 + 0x18) - 1) * 0xc0;
  uVar40 = *(int *)(*(long *)(lVar23 + 0x20) + 8 + lVar29) -
           *(int *)(*(long *)(lVar23 + 0x20) + lVar29);
  if (**(int **)((long)user_data + 0x30) == 0) goto LAB_0012a2e0;
  p_t1 = (opj_t1_t *)opj_tls_get(tls,0);
  if (p_t1 == (opj_t1_t *)0x0) {
    p_t1 = opj_t1_create(0);
    if (p_t1 == (opj_t1_t *)0x0) {
      opj_event_msg(*(opj_event_mgr_t **)((long)user_data + 0x38),1,
                    "Cannot allocate Tier 1 handle\n");
    }
    else {
      OVar21 = opj_tls_set(tls,0,p_t1,opj_t1_destroy_wrapper);
      if (OVar21 != 0) goto LAB_00129ccd;
      opj_event_msg(*(opj_event_mgr_t **)((long)user_data + 0x38),1,
                    "Unable to set t1 handle as TLS\n");
      opj_t1_destroy(p_t1);
    }
  }
  else {
LAB_00129ccd:
    p_t1->mustuse_cblkdatabuffer = *(OPJ_BOOL *)((long)user_data + 0x28);
    uVar43 = *(uint *)(lVar52 + 0x10);
    OVar49 = *(OPJ_UINT32 *)(lVar52 + 0x328);
    p_manager = *(opj_event_mgr_t **)((long)user_data + 0x38);
    p_manager_mutex = *(opj_mutex_t **)((long)user_data + 0x40);
    OVar21 = *(OPJ_BOOL *)((long)user_data + 0x48);
    if ((uVar43 & 0x40) == 0) {
      (p_t1->mqc).lut_ctxno_zc_orient = "" + (uint)(piVar51[4] << 9);
      OVar20 = opj_t1_allocate_buffers(p_t1,cblk->x1 - cblk->x0,cblk->y1 - cblk->y0);
      if (OVar20 != 0) {
        uVar35 = OVar49 + cblk->numbps;
        if ((int)uVar35 < 0x1f) {
          opj_mqc_resetstates(&p_t1->mqc);
          uVar33 = 0;
          opj_mqc_setstate(&p_t1->mqc,0x12,0,0x2e);
          opj_mqc_setstate(&p_t1->mqc,0x11,0,3);
          opj_mqc_setstate(&p_t1->mqc,0,0,4);
          uVar36 = cblk->numchunks;
          if (((ulong)uVar36 < 2) && (p_t1->mustuse_cblkdatabuffer == 0)) {
            if (uVar36 != 1) goto LAB_00129dbd;
            local_70 = cblk->chunks->data;
          }
          else {
            for (lVar29 = 0; (ulong)uVar36 << 4 != lVar29; lVar29 = lVar29 + 0x10) {
              uVar33 = (ulong)(uint)((int)uVar33 + *(int *)((long)&cblk->chunks->len + lVar29));
            }
            uVar36 = (int)uVar33 + 2;
            if (p_t1->cblkdatabuffersize < uVar36) {
              pOVar24 = (OPJ_BYTE *)opj_realloc(p_t1->cblkdatabuffer,(ulong)uVar36);
              if (pOVar24 == (OPJ_BYTE *)0x0) goto LAB_0012a2d7;
              p_t1->cblkdatabuffer = pOVar24;
              (pOVar24 + uVar33)[0] = '\0';
              (pOVar24 + uVar33)[1] = '\0';
              p_t1->cblkdatabuffersize = uVar36;
            }
            local_70 = p_t1->cblkdatabuffer;
            lVar29 = 8;
            uVar36 = 0;
            for (uVar33 = 0; uVar33 < cblk->numchunks; uVar33 = uVar33 + 1) {
              memcpy(local_70 + uVar36,*(void **)((long)cblk->chunks + lVar29 + -8),
                     (ulong)*(uint *)((long)&cblk->chunks->data + lVar29));
              uVar36 = uVar36 + *(int *)((long)&cblk->chunks->data + lVar29);
              lVar29 = lVar29 + 0x10;
            }
          }
          if (cblk->decoded_data == (OPJ_INT32 *)0x0) {
            local_58 = (OPJ_INT32 *)0x0;
          }
          else {
            local_58 = p_t1->data;
            p_t1->data = cblk->decoded_data;
          }
          uVar36 = 2;
          local_ac = 0;
          for (uVar33 = 0; uVar33 < cblk->real_num_segs; uVar33 = uVar33 + 1) {
            bVar66 = (uVar43 & 1) == 0;
            poVar62 = cblk->segs;
            bVar64 = (int)(cblk->numbps - 4) < (int)uVar35;
            bVar65 = 1 < uVar36;
            OVar49 = poVar62[uVar33].len;
            if ((bVar65 || bVar66) || bVar64) {
              opj_mqc_init_dec(&p_t1->mqc,local_70 + local_ac,OVar49,2);
            }
            else {
              opj_mqc_raw_init_dec(&p_t1->mqc,local_70 + local_ac,OVar49,2);
            }
            poVar62 = poVar62 + uVar33;
            local_ac = local_ac + poVar62->len;
            uVar28 = 0;
            for (; (uVar28 < poVar62->real_num_passes && (0 < (int)uVar35));
                uVar35 = uVar35 - (uVar27 == 3)) {
              if (uVar36 == 2) {
                opj_t1_dec_clnpass(p_t1,uVar35,uVar43);
              }
              else {
                bVar26 = (byte)uVar35;
                if (uVar36 == 1) {
                  if ((bVar65 || bVar66) || bVar64) {
                    uVar27 = p_t1->w;
                    uVar42 = (ulong)uVar27;
                    if (uVar42 == 0x40) {
                      puVar25 = (uint *)p_t1->data;
                      poVar34 = p_t1->flags;
                      ppoVar53 = (p_t1->mqc).curctx;
                      uVar31 = (p_t1->mqc).c;
                      uVar48 = (p_t1->mqc).a;
                      OVar49 = (p_t1->mqc).ct;
                      if (p_t1->h == 0x40) {
                        puVar58 = poVar34 + 0x43;
                        uVar44 = (uint)(1 << (bVar26 & 0x1f)) >> 1;
                        uVar45 = -uVar44;
                        for (uVar27 = 0; uVar27 < 0x40; uVar27 = uVar27 + 4) {
                          for (iVar32 = 0; iVar32 != 0x40; iVar32 = iVar32 + 1) {
                            uVar37 = *puVar58;
                            if (uVar37 != 0) {
                              if ((uVar37 & 0x200010) == 0x10) {
                                uVar42 = (ulong)(0xf - ((uVar37 & 0x1ef) == 0));
                                if ((uVar37 >> 0x14 & 1) != 0) {
                                  uVar42 = 0x10;
                                }
                                ppoVar53 = (p_t1->mqc).ctxs + uVar42;
                                poVar7 = *ppoVar53;
                                uVar47 = poVar7->qeval;
                                uVar55 = uVar48 - uVar47;
                                if (uVar31 >> 0x10 < uVar47) {
                                  uVar38 = poVar7->mps;
                                  *ppoVar53 = (&poVar7->nmps)[uVar47 <= uVar55];
                                  uVar48 = uVar47;
                                  do {
                                    if (OVar49 == 0) {
                                      pOVar24 = (p_t1->mqc).bp;
                                      bVar26 = pOVar24[1];
                                      if (*pOVar24 == 0xff) {
                                        if (bVar26 < 0x90) {
                                          (p_t1->mqc).bp = pOVar24 + 1;
                                          uVar31 = uVar31 + (uint)bVar26 * 0x200;
                                          OVar49 = 7;
                                          goto LAB_0012a569;
                                        }
                                        uVar31 = uVar31 + 0xff00;
                                        pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (p_t1->mqc).bp = pOVar24 + 1;
                                        uVar31 = uVar31 + (uint)bVar26 * 0x100;
                                      }
                                      OVar49 = 8;
                                    }
LAB_0012a569:
                                    uVar48 = uVar48 * 2;
                                    uVar31 = uVar31 * 2;
                                    OVar49 = OVar49 - 1;
                                  } while (uVar48 < 0x8000);
                                  uVar46 = (uint)(uVar38 == 0);
                                  if (uVar55 < uVar47) {
                                    uVar46 = uVar38;
                                  }
                                }
                                else {
                                  uVar31 = uVar31 + uVar47 * -0x10000;
                                  uVar48 = uVar55;
                                  if ((short)uVar55 < 0) {
                                    uVar46 = poVar7->mps;
                                  }
                                  else {
                                    uVar38 = poVar7->mps;
                                    *ppoVar53 = (&poVar7->nmps)[uVar55 < uVar47];
                                    do {
                                      if (OVar49 == 0) {
                                        pOVar24 = (p_t1->mqc).bp;
                                        bVar26 = pOVar24[1];
                                        if (*pOVar24 == 0xff) {
                                          if (bVar26 < 0x90) {
                                            (p_t1->mqc).bp = pOVar24 + 1;
                                            uVar31 = uVar31 + (uint)bVar26 * 0x200;
                                            OVar49 = 7;
                                            goto LAB_0012a5f8;
                                          }
                                          uVar31 = uVar31 + 0xff00;
                                          pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                          *pOVar1 = *pOVar1 + 1;
                                        }
                                        else {
                                          (p_t1->mqc).bp = pOVar24 + 1;
                                          uVar31 = uVar31 + (uint)bVar26 * 0x100;
                                        }
                                        OVar49 = 8;
                                      }
LAB_0012a5f8:
                                      uVar48 = uVar48 * 2;
                                      uVar31 = uVar31 * 2;
                                      OVar49 = OVar49 - 1;
                                    } while (uVar48 < 0x8000);
                                    uVar46 = (uint)(uVar38 == 0);
                                    if (uVar47 <= uVar55) {
                                      uVar46 = uVar38;
                                    }
                                  }
                                }
                                uVar47 = uVar44;
                                if (uVar46 == *puVar25 >> 0x1f) {
                                  uVar47 = uVar45;
                                }
                                *puVar25 = uVar47 + *puVar25;
                                uVar37 = uVar37 | 0x100000;
                              }
                              if ((uVar37 & 0x1000080) == 0x80) {
                                uVar42 = (ulong)(0xf - ((uVar37 & 0xf78) == 0));
                                if ((uVar37 >> 0x17 & 1) != 0) {
                                  uVar42 = 0x10;
                                }
                                ppoVar53 = (p_t1->mqc).ctxs + uVar42;
                                poVar7 = *ppoVar53;
                                uVar47 = poVar7->qeval;
                                uVar55 = uVar48 - uVar47;
                                if (uVar31 >> 0x10 < uVar47) {
                                  uVar38 = poVar7->mps;
                                  *ppoVar53 = (&poVar7->nmps)[uVar47 <= uVar55];
                                  uVar48 = uVar47;
                                  do {
                                    if (OVar49 == 0) {
                                      pOVar24 = (p_t1->mqc).bp;
                                      bVar26 = pOVar24[1];
                                      if (*pOVar24 == 0xff) {
                                        if (bVar26 < 0x90) {
                                          (p_t1->mqc).bp = pOVar24 + 1;
                                          uVar31 = uVar31 + (uint)bVar26 * 0x200;
                                          OVar49 = 7;
                                          goto LAB_0012a70c;
                                        }
                                        uVar31 = uVar31 + 0xff00;
                                        pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (p_t1->mqc).bp = pOVar24 + 1;
                                        uVar31 = uVar31 + (uint)bVar26 * 0x100;
                                      }
                                      OVar49 = 8;
                                    }
LAB_0012a70c:
                                    uVar48 = uVar48 * 2;
                                    uVar31 = uVar31 * 2;
                                    OVar49 = OVar49 - 1;
                                  } while (uVar48 < 0x8000);
                                  uVar46 = (uint)(uVar38 == 0);
                                  if (uVar55 < uVar47) {
                                    uVar46 = uVar38;
                                  }
                                }
                                else {
                                  uVar31 = uVar31 + uVar47 * -0x10000;
                                  uVar48 = uVar55;
                                  if ((short)uVar55 < 0) {
                                    uVar46 = poVar7->mps;
                                  }
                                  else {
                                    uVar38 = poVar7->mps;
                                    *ppoVar53 = (&poVar7->nmps)[uVar55 < uVar47];
                                    do {
                                      if (OVar49 == 0) {
                                        pOVar24 = (p_t1->mqc).bp;
                                        bVar26 = pOVar24[1];
                                        if (*pOVar24 == 0xff) {
                                          if (bVar26 < 0x90) {
                                            (p_t1->mqc).bp = pOVar24 + 1;
                                            uVar31 = uVar31 + (uint)bVar26 * 0x200;
                                            OVar49 = 7;
                                            goto LAB_0012a79b;
                                          }
                                          uVar31 = uVar31 + 0xff00;
                                          pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                          *pOVar1 = *pOVar1 + 1;
                                        }
                                        else {
                                          (p_t1->mqc).bp = pOVar24 + 1;
                                          uVar31 = uVar31 + (uint)bVar26 * 0x100;
                                        }
                                        OVar49 = 8;
                                      }
LAB_0012a79b:
                                      uVar48 = uVar48 * 2;
                                      uVar31 = uVar31 * 2;
                                      OVar49 = OVar49 - 1;
                                    } while (uVar48 < 0x8000);
                                    uVar46 = (uint)(uVar38 == 0);
                                    if (uVar47 <= uVar55) {
                                      uVar46 = uVar38;
                                    }
                                  }
                                }
                                uVar47 = uVar44;
                                if (uVar46 == puVar25[0x40] >> 0x1f) {
                                  uVar47 = uVar45;
                                }
                                puVar25[0x40] = uVar47 + puVar25[0x40];
                                uVar37 = uVar37 | 0x800000;
                              }
                              if ((uVar37 & 0x8000400) == 0x400) {
                                uVar42 = (ulong)(0xf - ((uVar37 & 0x7bc0) == 0));
                                if ((uVar37 >> 0x1a & 1) != 0) {
                                  uVar42 = 0x10;
                                }
                                ppoVar53 = (p_t1->mqc).ctxs + uVar42;
                                poVar7 = *ppoVar53;
                                uVar47 = poVar7->qeval;
                                uVar55 = uVar48 - uVar47;
                                if (uVar31 >> 0x10 < uVar47) {
                                  uVar38 = poVar7->mps;
                                  *ppoVar53 = (&poVar7->nmps)[uVar47 <= uVar55];
                                  uVar48 = uVar47;
                                  do {
                                    if (OVar49 == 0) {
                                      pOVar24 = (p_t1->mqc).bp;
                                      bVar26 = pOVar24[1];
                                      if (*pOVar24 == 0xff) {
                                        if (bVar26 < 0x90) {
                                          (p_t1->mqc).bp = pOVar24 + 1;
                                          uVar31 = uVar31 + (uint)bVar26 * 0x200;
                                          OVar49 = 7;
                                          goto LAB_0012a8b7;
                                        }
                                        uVar31 = uVar31 + 0xff00;
                                        pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (p_t1->mqc).bp = pOVar24 + 1;
                                        uVar31 = uVar31 + (uint)bVar26 * 0x100;
                                      }
                                      OVar49 = 8;
                                    }
LAB_0012a8b7:
                                    uVar48 = uVar48 * 2;
                                    uVar31 = uVar31 * 2;
                                    OVar49 = OVar49 - 1;
                                  } while (uVar48 < 0x8000);
                                  uVar46 = (uint)(uVar38 == 0);
                                  if (uVar55 < uVar47) {
                                    uVar46 = uVar38;
                                  }
                                }
                                else {
                                  uVar31 = uVar31 + uVar47 * -0x10000;
                                  uVar48 = uVar55;
                                  if ((short)uVar55 < 0) {
                                    uVar46 = poVar7->mps;
                                  }
                                  else {
                                    uVar38 = poVar7->mps;
                                    *ppoVar53 = (&poVar7->nmps)[uVar55 < uVar47];
                                    do {
                                      if (OVar49 == 0) {
                                        pOVar24 = (p_t1->mqc).bp;
                                        bVar26 = pOVar24[1];
                                        if (*pOVar24 == 0xff) {
                                          if (bVar26 < 0x90) {
                                            (p_t1->mqc).bp = pOVar24 + 1;
                                            uVar31 = uVar31 + (uint)bVar26 * 0x200;
                                            OVar49 = 7;
                                            goto LAB_0012a946;
                                          }
                                          uVar31 = uVar31 + 0xff00;
                                          pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                          *pOVar1 = *pOVar1 + 1;
                                        }
                                        else {
                                          (p_t1->mqc).bp = pOVar24 + 1;
                                          uVar31 = uVar31 + (uint)bVar26 * 0x100;
                                        }
                                        OVar49 = 8;
                                      }
LAB_0012a946:
                                      uVar48 = uVar48 * 2;
                                      uVar31 = uVar31 * 2;
                                      OVar49 = OVar49 - 1;
                                    } while (uVar48 < 0x8000);
                                    uVar46 = (uint)(uVar38 == 0);
                                    if (uVar47 <= uVar55) {
                                      uVar46 = uVar38;
                                    }
                                  }
                                }
                                uVar47 = uVar44;
                                if (uVar46 == puVar25[0x80] >> 0x1f) {
                                  uVar47 = uVar45;
                                }
                                puVar25[0x80] = uVar47 + puVar25[0x80];
                                uVar37 = uVar37 | 0x4000000;
                              }
                              if ((uVar37 & 0x40002000) == 0x2000) {
                                uVar42 = (ulong)(0xf - ((uVar37 & 0x3de00) == 0));
                                if ((uVar37 >> 0x1d & 1) != 0) {
                                  uVar42 = 0x10;
                                }
                                ppoVar53 = (p_t1->mqc).ctxs + uVar42;
                                poVar7 = *ppoVar53;
                                uVar47 = poVar7->qeval;
                                uVar55 = uVar48 - uVar47;
                                if (uVar31 >> 0x10 < uVar47) {
                                  uVar38 = poVar7->mps;
                                  *ppoVar53 = (&poVar7->nmps)[uVar47 <= uVar55];
                                  uVar48 = uVar47;
                                  do {
                                    if (OVar49 == 0) {
                                      pOVar24 = (p_t1->mqc).bp;
                                      bVar26 = pOVar24[1];
                                      if (*pOVar24 == 0xff) {
                                        if (bVar26 < 0x90) {
                                          (p_t1->mqc).bp = pOVar24 + 1;
                                          uVar31 = uVar31 + (uint)bVar26 * 0x200;
                                          OVar49 = 7;
                                          goto LAB_0012aa62;
                                        }
                                        uVar31 = uVar31 + 0xff00;
                                        pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (p_t1->mqc).bp = pOVar24 + 1;
                                        uVar31 = uVar31 + (uint)bVar26 * 0x100;
                                      }
                                      OVar49 = 8;
                                    }
LAB_0012aa62:
                                    uVar48 = uVar48 * 2;
                                    uVar31 = uVar31 * 2;
                                    OVar49 = OVar49 - 1;
                                  } while (uVar48 < 0x8000);
                                  uVar46 = (uint)(uVar38 == 0);
                                  if (uVar55 < uVar47) {
                                    uVar46 = uVar38;
                                  }
                                }
                                else {
                                  uVar31 = uVar31 + uVar47 * -0x10000;
                                  uVar48 = uVar55;
                                  if ((short)uVar55 < 0) {
                                    uVar46 = poVar7->mps;
                                  }
                                  else {
                                    uVar38 = poVar7->mps;
                                    *ppoVar53 = (&poVar7->nmps)[uVar55 < uVar47];
                                    do {
                                      if (OVar49 == 0) {
                                        pOVar24 = (p_t1->mqc).bp;
                                        bVar26 = pOVar24[1];
                                        if (*pOVar24 == 0xff) {
                                          if (bVar26 < 0x90) {
                                            (p_t1->mqc).bp = pOVar24 + 1;
                                            uVar31 = uVar31 + (uint)bVar26 * 0x200;
                                            OVar49 = 7;
                                            goto LAB_0012aaf1;
                                          }
                                          uVar31 = uVar31 + 0xff00;
                                          pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                          *pOVar1 = *pOVar1 + 1;
                                        }
                                        else {
                                          (p_t1->mqc).bp = pOVar24 + 1;
                                          uVar31 = uVar31 + (uint)bVar26 * 0x100;
                                        }
                                        OVar49 = 8;
                                      }
LAB_0012aaf1:
                                      uVar48 = uVar48 * 2;
                                      uVar31 = uVar31 * 2;
                                      OVar49 = OVar49 - 1;
                                    } while (uVar48 < 0x8000);
                                    uVar46 = (uint)(uVar38 == 0);
                                    if (uVar47 <= uVar55) {
                                      uVar46 = uVar38;
                                    }
                                  }
                                }
                                uVar47 = uVar44;
                                if (uVar46 == puVar25[0xc0] >> 0x1f) {
                                  uVar47 = uVar45;
                                }
                                puVar25[0xc0] = uVar47 + puVar25[0xc0];
                                uVar37 = uVar37 | 0x20000000;
                              }
                              *puVar58 = uVar37;
                            }
                            puVar25 = puVar25 + 1;
                            puVar58 = puVar58 + 1;
                          }
                          puVar25 = puVar25 + 0xc0;
                          puVar58 = puVar58 + 2;
                        }
                        (p_t1->mqc).curctx = ppoVar53;
                        (p_t1->mqc).c = uVar31;
                        (p_t1->mqc).a = uVar48;
                        (p_t1->mqc).ct = OVar49;
                        goto LAB_0012b7fe;
                      }
                    }
                    else {
                      puVar25 = (uint *)p_t1->data;
                      poVar34 = p_t1->flags;
                      ppoVar53 = (p_t1->mqc).curctx;
                      uVar31 = (p_t1->mqc).c;
                      uVar48 = (p_t1->mqc).a;
                      OVar49 = (p_t1->mqc).ct;
                    }
                    puVar58 = poVar34 + (uVar27 + 3);
                    uVar37 = (uint)(1 << (bVar26 & 0x1f)) >> 1;
                    uVar47 = -uVar37;
                    uVar44 = uVar27 * 3;
                    for (uVar45 = 0; uVar55 = p_t1->h, uVar45 < (uVar55 & 0xfffffffc);
                        uVar45 = uVar45 + 4) {
                      for (uVar55 = 0; uVar55 != uVar27; uVar55 = uVar55 + 1) {
                        uVar38 = *puVar58;
                        if (uVar38 != 0) {
                          if ((uVar38 & 0x200010) == 0x10) {
                            uVar30 = (ulong)(0xf - ((uVar38 & 0x1ef) == 0));
                            if ((uVar38 >> 0x14 & 1) != 0) {
                              uVar30 = 0x10;
                            }
                            ppoVar53 = (p_t1->mqc).ctxs + uVar30;
                            poVar7 = *ppoVar53;
                            uVar46 = poVar7->qeval;
                            uVar56 = uVar48 - uVar46;
                            if (uVar31 >> 0x10 < uVar46) {
                              uVar6 = poVar7->mps;
                              *ppoVar53 = (&poVar7->nmps)[uVar46 <= uVar56];
                              uVar48 = uVar46;
                              do {
                                if (OVar49 == 0) {
                                  pOVar24 = (p_t1->mqc).bp;
                                  bVar26 = pOVar24[1];
                                  if (*pOVar24 == 0xff) {
                                    if (bVar26 < 0x90) {
                                      (p_t1->mqc).bp = pOVar24 + 1;
                                      uVar31 = uVar31 + (uint)bVar26 * 0x200;
                                      OVar49 = 7;
                                      goto LAB_0012afaa;
                                    }
                                    uVar31 = uVar31 + 0xff00;
                                    pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                    *pOVar1 = *pOVar1 + 1;
                                  }
                                  else {
                                    (p_t1->mqc).bp = pOVar24 + 1;
                                    uVar31 = uVar31 + (uint)bVar26 * 0x100;
                                  }
                                  OVar49 = 8;
                                }
LAB_0012afaa:
                                uVar48 = uVar48 * 2;
                                uVar31 = uVar31 * 2;
                                OVar49 = OVar49 - 1;
                              } while (uVar48 < 0x8000);
                              uVar60 = (uint)(uVar6 == 0);
                              if (uVar56 < uVar46) {
                                uVar60 = uVar6;
                              }
                            }
                            else {
                              uVar31 = uVar31 + uVar46 * -0x10000;
                              uVar48 = uVar56;
                              if ((short)uVar56 < 0) {
                                uVar60 = poVar7->mps;
                              }
                              else {
                                uVar6 = poVar7->mps;
                                *ppoVar53 = (&poVar7->nmps)[uVar56 < uVar46];
                                do {
                                  if (OVar49 == 0) {
                                    pOVar24 = (p_t1->mqc).bp;
                                    bVar26 = pOVar24[1];
                                    if (*pOVar24 == 0xff) {
                                      if (bVar26 < 0x90) {
                                        (p_t1->mqc).bp = pOVar24 + 1;
                                        uVar31 = uVar31 + (uint)bVar26 * 0x200;
                                        OVar49 = 7;
                                        goto LAB_0012b034;
                                      }
                                      uVar31 = uVar31 + 0xff00;
                                      pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                      *pOVar1 = *pOVar1 + 1;
                                    }
                                    else {
                                      (p_t1->mqc).bp = pOVar24 + 1;
                                      uVar31 = uVar31 + (uint)bVar26 * 0x100;
                                    }
                                    OVar49 = 8;
                                  }
LAB_0012b034:
                                  uVar48 = uVar48 * 2;
                                  uVar31 = uVar31 * 2;
                                  OVar49 = OVar49 - 1;
                                } while (uVar48 < 0x8000);
                                uVar60 = (uint)(uVar6 == 0);
                                if (uVar46 <= uVar56) {
                                  uVar60 = uVar6;
                                }
                              }
                            }
                            uVar46 = uVar37;
                            if (uVar60 == *puVar25 >> 0x1f) {
                              uVar46 = uVar47;
                            }
                            *puVar25 = uVar46 + *puVar25;
                            uVar38 = uVar38 | 0x100000;
                          }
                          if ((uVar38 & 0x1000080) == 0x80) {
                            uVar30 = (ulong)(0xf - ((uVar38 & 0xf78) == 0));
                            if ((uVar38 >> 0x17 & 1) != 0) {
                              uVar30 = 0x10;
                            }
                            ppoVar53 = (p_t1->mqc).ctxs + uVar30;
                            poVar7 = *ppoVar53;
                            uVar46 = poVar7->qeval;
                            uVar56 = uVar48 - uVar46;
                            if (uVar31 >> 0x10 < uVar46) {
                              uVar6 = poVar7->mps;
                              *ppoVar53 = (&poVar7->nmps)[uVar46 <= uVar56];
                              uVar48 = uVar46;
                              do {
                                if (OVar49 == 0) {
                                  pOVar24 = (p_t1->mqc).bp;
                                  bVar26 = pOVar24[1];
                                  if (*pOVar24 == 0xff) {
                                    if (bVar26 < 0x90) {
                                      (p_t1->mqc).bp = pOVar24 + 1;
                                      uVar31 = uVar31 + (uint)bVar26 * 0x200;
                                      OVar49 = 7;
                                      goto LAB_0012b13c;
                                    }
                                    uVar31 = uVar31 + 0xff00;
                                    pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                    *pOVar1 = *pOVar1 + 1;
                                  }
                                  else {
                                    (p_t1->mqc).bp = pOVar24 + 1;
                                    uVar31 = uVar31 + (uint)bVar26 * 0x100;
                                  }
                                  OVar49 = 8;
                                }
LAB_0012b13c:
                                uVar48 = uVar48 * 2;
                                uVar31 = uVar31 * 2;
                                OVar49 = OVar49 - 1;
                              } while (uVar48 < 0x8000);
                              uVar60 = (uint)(uVar6 == 0);
                              if (uVar56 < uVar46) {
                                uVar60 = uVar6;
                              }
                            }
                            else {
                              uVar31 = uVar31 + uVar46 * -0x10000;
                              uVar48 = uVar56;
                              if ((short)uVar56 < 0) {
                                uVar60 = poVar7->mps;
                              }
                              else {
                                uVar6 = poVar7->mps;
                                *ppoVar53 = (&poVar7->nmps)[uVar56 < uVar46];
                                do {
                                  if (OVar49 == 0) {
                                    pOVar24 = (p_t1->mqc).bp;
                                    bVar26 = pOVar24[1];
                                    if (*pOVar24 == 0xff) {
                                      if (bVar26 < 0x90) {
                                        (p_t1->mqc).bp = pOVar24 + 1;
                                        uVar31 = uVar31 + (uint)bVar26 * 0x200;
                                        OVar49 = 7;
                                        goto LAB_0012b1c6;
                                      }
                                      uVar31 = uVar31 + 0xff00;
                                      pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                      *pOVar1 = *pOVar1 + 1;
                                    }
                                    else {
                                      (p_t1->mqc).bp = pOVar24 + 1;
                                      uVar31 = uVar31 + (uint)bVar26 * 0x100;
                                    }
                                    OVar49 = 8;
                                  }
LAB_0012b1c6:
                                  uVar48 = uVar48 * 2;
                                  uVar31 = uVar31 * 2;
                                  OVar49 = OVar49 - 1;
                                } while (uVar48 < 0x8000);
                                uVar60 = (uint)(uVar6 == 0);
                                if (uVar46 <= uVar56) {
                                  uVar60 = uVar6;
                                }
                              }
                            }
                            uVar46 = uVar37;
                            if (uVar60 == puVar25[uVar42] >> 0x1f) {
                              uVar46 = uVar47;
                            }
                            puVar25[uVar42] = uVar46 + puVar25[uVar42];
                            uVar38 = uVar38 | 0x800000;
                          }
                          if ((uVar38 & 0x8000400) == 0x400) {
                            uVar30 = (ulong)(0xf - ((uVar38 & 0x7bc0) == 0));
                            if ((uVar38 >> 0x1a & 1) != 0) {
                              uVar30 = 0x10;
                            }
                            ppoVar53 = (p_t1->mqc).ctxs + uVar30;
                            poVar7 = *ppoVar53;
                            uVar46 = poVar7->qeval;
                            uVar56 = uVar48 - uVar46;
                            if (uVar31 >> 0x10 < uVar46) {
                              uVar6 = poVar7->mps;
                              *ppoVar53 = (&poVar7->nmps)[uVar46 <= uVar56];
                              uVar48 = uVar46;
                              do {
                                if (OVar49 == 0) {
                                  pOVar24 = (p_t1->mqc).bp;
                                  bVar26 = pOVar24[1];
                                  if (*pOVar24 == 0xff) {
                                    if (bVar26 < 0x90) {
                                      (p_t1->mqc).bp = pOVar24 + 1;
                                      uVar31 = uVar31 + (uint)bVar26 * 0x200;
                                      OVar49 = 7;
                                      goto LAB_0012b2d5;
                                    }
                                    uVar31 = uVar31 + 0xff00;
                                    pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                    *pOVar1 = *pOVar1 + 1;
                                  }
                                  else {
                                    (p_t1->mqc).bp = pOVar24 + 1;
                                    uVar31 = uVar31 + (uint)bVar26 * 0x100;
                                  }
                                  OVar49 = 8;
                                }
LAB_0012b2d5:
                                uVar48 = uVar48 * 2;
                                uVar31 = uVar31 * 2;
                                OVar49 = OVar49 - 1;
                              } while (uVar48 < 0x8000);
                              uVar60 = (uint)(uVar6 == 0);
                              if (uVar56 < uVar46) {
                                uVar60 = uVar6;
                              }
                            }
                            else {
                              uVar31 = uVar31 + uVar46 * -0x10000;
                              uVar48 = uVar56;
                              if ((short)uVar56 < 0) {
                                uVar60 = poVar7->mps;
                              }
                              else {
                                uVar6 = poVar7->mps;
                                *ppoVar53 = (&poVar7->nmps)[uVar56 < uVar46];
                                do {
                                  if (OVar49 == 0) {
                                    pOVar24 = (p_t1->mqc).bp;
                                    bVar26 = pOVar24[1];
                                    if (*pOVar24 == 0xff) {
                                      if (bVar26 < 0x90) {
                                        (p_t1->mqc).bp = pOVar24 + 1;
                                        uVar31 = uVar31 + (uint)bVar26 * 0x200;
                                        OVar49 = 7;
                                        goto LAB_0012b35f;
                                      }
                                      uVar31 = uVar31 + 0xff00;
                                      pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                      *pOVar1 = *pOVar1 + 1;
                                    }
                                    else {
                                      (p_t1->mqc).bp = pOVar24 + 1;
                                      uVar31 = uVar31 + (uint)bVar26 * 0x100;
                                    }
                                    OVar49 = 8;
                                  }
LAB_0012b35f:
                                  uVar48 = uVar48 * 2;
                                  uVar31 = uVar31 * 2;
                                  OVar49 = OVar49 - 1;
                                } while (uVar48 < 0x8000);
                                uVar60 = (uint)(uVar6 == 0);
                                if (uVar46 <= uVar56) {
                                  uVar60 = uVar6;
                                }
                              }
                            }
                            uVar46 = uVar37;
                            if (uVar60 == puVar25[uVar27 * 2] >> 0x1f) {
                              uVar46 = uVar47;
                            }
                            puVar25[uVar27 * 2] = uVar46 + puVar25[uVar27 * 2];
                            uVar38 = uVar38 | 0x4000000;
                          }
                          if ((uVar38 & 0x40002000) == 0x2000) {
                            uVar30 = (ulong)(0xf - ((uVar38 & 0x3de00) == 0));
                            if ((uVar38 >> 0x1d & 1) != 0) {
                              uVar30 = 0x10;
                            }
                            ppoVar53 = (p_t1->mqc).ctxs + uVar30;
                            poVar7 = *ppoVar53;
                            uVar46 = poVar7->qeval;
                            uVar56 = uVar48 - uVar46;
                            if (uVar31 >> 0x10 < uVar46) {
                              uVar6 = poVar7->mps;
                              *ppoVar53 = (&poVar7->nmps)[uVar46 <= uVar56];
                              uVar48 = uVar46;
                              do {
                                if (OVar49 == 0) {
                                  pOVar24 = (p_t1->mqc).bp;
                                  bVar26 = pOVar24[1];
                                  if (*pOVar24 == 0xff) {
                                    if (bVar26 < 0x90) {
                                      (p_t1->mqc).bp = pOVar24 + 1;
                                      uVar31 = uVar31 + (uint)bVar26 * 0x200;
                                      OVar49 = 7;
                                      goto LAB_0012b471;
                                    }
                                    uVar31 = uVar31 + 0xff00;
                                    pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                    *pOVar1 = *pOVar1 + 1;
                                  }
                                  else {
                                    (p_t1->mqc).bp = pOVar24 + 1;
                                    uVar31 = uVar31 + (uint)bVar26 * 0x100;
                                  }
                                  OVar49 = 8;
                                }
LAB_0012b471:
                                uVar48 = uVar48 * 2;
                                uVar31 = uVar31 * 2;
                                OVar49 = OVar49 - 1;
                              } while (uVar48 < 0x8000);
                              uVar60 = (uint)(uVar6 == 0);
                              if (uVar56 < uVar46) {
                                uVar60 = uVar6;
                              }
                            }
                            else {
                              uVar31 = uVar31 + uVar46 * -0x10000;
                              uVar48 = uVar56;
                              if ((short)uVar56 < 0) {
                                uVar60 = poVar7->mps;
                              }
                              else {
                                uVar6 = poVar7->mps;
                                *ppoVar53 = (&poVar7->nmps)[uVar56 < uVar46];
                                do {
                                  if (OVar49 == 0) {
                                    pOVar24 = (p_t1->mqc).bp;
                                    bVar26 = pOVar24[1];
                                    if (*pOVar24 == 0xff) {
                                      if (bVar26 < 0x90) {
                                        (p_t1->mqc).bp = pOVar24 + 1;
                                        uVar31 = uVar31 + (uint)bVar26 * 0x200;
                                        OVar49 = 7;
                                        goto LAB_0012b4fb;
                                      }
                                      uVar31 = uVar31 + 0xff00;
                                      pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                      *pOVar1 = *pOVar1 + 1;
                                    }
                                    else {
                                      (p_t1->mqc).bp = pOVar24 + 1;
                                      uVar31 = uVar31 + (uint)bVar26 * 0x100;
                                    }
                                    OVar49 = 8;
                                  }
LAB_0012b4fb:
                                  uVar48 = uVar48 * 2;
                                  uVar31 = uVar31 * 2;
                                  OVar49 = OVar49 - 1;
                                } while (uVar48 < 0x8000);
                                uVar60 = (uint)(uVar6 == 0);
                                if (uVar46 <= uVar56) {
                                  uVar60 = uVar6;
                                }
                              }
                            }
                            uVar46 = uVar37;
                            if (uVar60 == puVar25[uVar44] >> 0x1f) {
                              uVar46 = uVar47;
                            }
                            puVar25[uVar44] = uVar46 + puVar25[uVar44];
                            uVar38 = uVar38 | 0x20000000;
                          }
                          *puVar58 = uVar38;
                        }
                        puVar25 = puVar25 + 1;
                        puVar58 = puVar58 + 1;
                      }
                      puVar25 = puVar25 + uVar44;
                      puVar58 = puVar58 + 2;
                    }
                    (p_t1->mqc).curctx = ppoVar53;
                    (p_t1->mqc).c = uVar31;
                    (p_t1->mqc).a = uVar48;
                    (p_t1->mqc).ct = OVar49;
                    if (uVar45 < uVar55) {
                      for (uVar31 = 0; uVar31 != uVar27; uVar31 = uVar31 + 1) {
                        for (uVar42 = 0; uVar42 < uVar55 - uVar45; uVar42 = uVar42 + 1) {
                          bVar26 = (char)uVar42 * '\x03';
                          if ((0x200010 << (bVar26 & 0x1f) & *puVar58) == 0x10 << (bVar26 & 0x1f)) {
                            uVar48 = *puVar58 >> (bVar26 & 0x1f);
                            iVar32 = 0xf - (uint)((uVar48 & 0x1ef) == 0);
                            if ((uVar48 >> 0x14 & 1) != 0) {
                              iVar32 = 0x10;
                            }
                            ppoVar53 = (opj_mqc_state_t **)
                                       ((long)(p_t1->mqc).ctxs + (ulong)(uint)(iVar32 << 3));
                            (p_t1->mqc).curctx = ppoVar53;
                            puVar8 = *(uint **)((long)(p_t1->mqc).ctxs + (ulong)(uint)(iVar32 << 3))
                            ;
                            uVar48 = *puVar8;
                            uVar44 = (p_t1->mqc).c;
                            uVar55 = (p_t1->mqc).a - uVar48;
                            (p_t1->mqc).a = uVar55;
                            if (uVar44 >> 0x10 < uVar48) {
                              uVar38 = puVar8[1];
                              (p_t1->mqc).a = uVar48;
                              *ppoVar53 = *(opj_mqc_state_t **)
                                           (puVar8 + (ulong)(uVar48 <= uVar55) * 2 + 2);
                              OVar49 = (p_t1->mqc).ct;
                              uVar46 = uVar48;
                              do {
                                if (OVar49 == 0) {
                                  pOVar24 = (p_t1->mqc).bp;
                                  bVar4 = pOVar24[1];
                                  if (*pOVar24 == 0xff) {
                                    if (bVar4 < 0x90) {
                                      (p_t1->mqc).bp = pOVar24 + 1;
                                      uVar44 = uVar44 + (uint)bVar4 * 0x200;
                                      OVar49 = 7;
                                      goto LAB_0012b6ad;
                                    }
                                    uVar44 = uVar44 + 0xff00;
                                    pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                    *pOVar1 = *pOVar1 + 1;
                                  }
                                  else {
                                    (p_t1->mqc).bp = pOVar24 + 1;
                                    uVar44 = uVar44 + (uint)bVar4 * 0x100;
                                  }
                                  OVar49 = 8;
                                }
LAB_0012b6ad:
                                uVar46 = uVar46 * 2;
                                (p_t1->mqc).a = uVar46;
                                uVar44 = uVar44 * 2;
                                (p_t1->mqc).c = uVar44;
                                OVar49 = OVar49 - 1;
                                (p_t1->mqc).ct = OVar49;
                              } while (uVar46 < 0x8000);
                              uVar44 = (uint)(uVar38 == 0);
                              if (uVar55 < uVar48) {
                                uVar44 = uVar38;
                              }
                            }
                            else {
                              OVar49 = uVar44 + uVar48 * -0x10000;
                              (p_t1->mqc).c = OVar49;
                              if ((short)uVar55 < 0) {
                                uVar44 = puVar8[1];
                              }
                              else {
                                uVar38 = puVar8[1];
                                *ppoVar53 = *(opj_mqc_state_t **)
                                             (puVar8 + (ulong)(uVar55 < uVar48) * 2 + 2);
                                OVar59 = (p_t1->mqc).ct;
                                uVar44 = uVar55;
                                do {
                                  if (OVar59 == 0) {
                                    pOVar24 = (p_t1->mqc).bp;
                                    bVar4 = pOVar24[1];
                                    if (*pOVar24 == 0xff) {
                                      if (bVar4 < 0x90) {
                                        (p_t1->mqc).bp = pOVar24 + 1;
                                        OVar49 = OVar49 + (uint)bVar4 * 0x200;
                                        OVar59 = 7;
                                        goto LAB_0012b745;
                                      }
                                      OVar49 = OVar49 + 0xff00;
                                      pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                      *pOVar1 = *pOVar1 + 1;
                                    }
                                    else {
                                      (p_t1->mqc).bp = pOVar24 + 1;
                                      OVar49 = OVar49 + (uint)bVar4 * 0x100;
                                    }
                                    OVar59 = 8;
                                  }
LAB_0012b745:
                                  uVar44 = uVar44 * 2;
                                  (p_t1->mqc).a = uVar44;
                                  OVar49 = OVar49 * 2;
                                  (p_t1->mqc).c = OVar49;
                                  OVar59 = OVar59 - 1;
                                  (p_t1->mqc).ct = OVar59;
                                } while (uVar44 < 0x8000);
                                uVar44 = (uint)(uVar38 == 0);
                                if (uVar48 <= uVar55) {
                                  uVar44 = uVar38;
                                }
                              }
                            }
                            uVar55 = uVar27 * (int)uVar42;
                            uVar48 = uVar37;
                            if (uVar44 == puVar25[uVar55] >> 0x1f) {
                              uVar48 = uVar47;
                            }
                            puVar25[uVar55] = uVar48 + puVar25[uVar55];
                            *puVar58 = *puVar58 | 0x100000 << (bVar26 & 0x1f);
                            uVar55 = p_t1->h;
                          }
                        }
                        puVar25 = puVar25 + 1;
                        puVar58 = puVar58 + 1;
                      }
                    }
                  }
                  else {
                    pOVar22 = p_t1->data;
                    uVar27 = p_t1->w;
                    poVar34 = p_t1->flags + (uVar27 + 3);
                    uVar48 = (uint)(1 << (bVar26 & 0x1f)) >> 1;
                    for (uVar31 = 0; uVar44 = p_t1->h, uVar42 = (ulong)uVar27,
                        uVar31 < (uVar44 & 0xfffffffc); uVar31 = uVar31 + 4) {
                      while ((int)uVar42 != 0) {
                        if (*poVar34 != 0) {
                          opj_t1_dec_refpass_step_raw(p_t1,poVar34,pOVar22,uVar48,0);
                          opj_t1_dec_refpass_step_raw(p_t1,poVar34,pOVar22 + uVar27,uVar48,1);
                          opj_t1_dec_refpass_step_raw(p_t1,poVar34,pOVar22 + uVar27 * 2,uVar48,2);
                          opj_t1_dec_refpass_step_raw(p_t1,poVar34,pOVar22 + uVar27 * 3,uVar48,3);
                        }
                        poVar34 = poVar34 + 1;
                        pOVar22 = pOVar22 + 1;
                        uVar42 = (ulong)((int)uVar42 - 1);
                      }
                      poVar34 = poVar34 + 2;
                      pOVar22 = pOVar22 + uVar27 * 3;
                    }
                    if (uVar31 < uVar44) {
                      for (uVar45 = 0; uVar45 != uVar27; uVar45 = uVar45 + 1) {
                        uVar42 = 0;
                        for (uVar30 = 0; uVar30 < uVar44 - uVar31; uVar30 = uVar30 + 1) {
                          opj_t1_dec_refpass_step_raw
                                    (p_t1,poVar34,pOVar22 + uVar42,uVar48,(OPJ_UINT32)uVar30);
                          uVar44 = p_t1->h;
                          uVar42 = (ulong)((int)uVar42 + uVar27);
                        }
                        poVar34 = poVar34 + 1;
                        pOVar22 = pOVar22 + 1;
                      }
                    }
                  }
                }
                else if ((bVar65 || bVar66) || bVar64) {
                  opj_t1_dec_sigpass_mqc(p_t1,uVar35,uVar43);
                }
                else {
                  pOVar22 = p_t1->data;
                  uVar27 = p_t1->w;
                  poVar34 = p_t1->flags + (uVar27 + 3);
                  uVar48 = (uint)(1 << (bVar26 & 0x1f)) >> 1 | 1 << (uVar35 & 0x1f);
                  for (uVar31 = 0; uVar44 = p_t1->h, uVar42 = (ulong)uVar27,
                      uVar31 < (uVar44 & 0xfffffffc); uVar31 = uVar31 + 4) {
                    while ((int)uVar42 != 0) {
                      if (*poVar34 != 0) {
                        opj_t1_dec_sigpass_step_raw(p_t1,poVar34,pOVar22,uVar48,uVar43 & 8,0);
                        opj_t1_dec_sigpass_step_raw(p_t1,poVar34,pOVar22 + uVar27,uVar48,0,1);
                        opj_t1_dec_sigpass_step_raw(p_t1,poVar34,pOVar22 + uVar27 * 2,uVar48,0,2);
                        opj_t1_dec_sigpass_step_raw(p_t1,poVar34,pOVar22 + uVar27 * 3,uVar48,0,3);
                      }
                      poVar34 = poVar34 + 1;
                      pOVar22 = pOVar22 + 1;
                      uVar42 = (ulong)((int)uVar42 - 1);
                    }
                    poVar34 = poVar34 + 2;
                    pOVar22 = pOVar22 + uVar27 * 3;
                  }
                  if (uVar31 < uVar44) {
                    for (uVar45 = 0; uVar45 != uVar27; uVar45 = uVar45 + 1) {
                      uVar42 = 0;
                      for (uVar30 = 0; uVar30 < uVar44 - uVar31; uVar30 = uVar30 + 1) {
                        opj_t1_dec_sigpass_step_raw
                                  (p_t1,poVar34,pOVar22 + uVar42,uVar48,uVar43 & 8,
                                   (OPJ_UINT32)uVar30);
                        uVar44 = p_t1->h;
                        uVar42 = (ulong)((int)uVar42 + uVar27);
                      }
                      poVar34 = poVar34 + 1;
                      pOVar22 = pOVar22 + 1;
                    }
                  }
                }
              }
LAB_0012b7fe:
              if (((byte)uVar43 >> 1 & ((bVar65 || bVar66) || bVar64)) != 0) {
                opj_mqc_resetstates(&p_t1->mqc);
                opj_mqc_setstate(&p_t1->mqc,0x12,0,0x2e);
                opj_mqc_setstate(&p_t1->mqc,0x11,0,3);
                opj_mqc_setstate(&p_t1->mqc,0,0,4);
              }
              uVar27 = uVar36 + 1;
              uVar36 = uVar27;
              if (uVar27 == 3) {
                uVar36 = 0;
              }
              uVar28 = uVar28 + 1;
            }
            opq_mqc_finish_dec(&p_t1->mqc);
          }
          if (OVar21 != 0) {
            pOVar24 = (p_t1->mqc).bp;
            pOVar54 = (p_t1->mqc).end;
            if (pOVar24 + 2 < pOVar54) {
              if (p_manager_mutex != (opj_mutex_t *)0x0) {
                opj_mutex_lock(p_manager_mutex);
                pOVar24 = (p_t1->mqc).bp;
                pOVar54 = (p_t1->mqc).end;
              }
              iVar32 = *(int *)&(p_t1->mqc).start;
              opj_event_msg(p_manager,2,
                            "PTERM check failure: %d remaining bytes in code block (%d used / %d)\n"
                            ,(ulong)(((int)pOVar54 - (int)pOVar24) - 2),
                            (ulong)(uint)((int)pOVar24 - iVar32),
                            (ulong)(uint)((int)pOVar54 - iVar32));
              if (p_manager_mutex != (opj_mutex_t *)0x0) {
LAB_0012b93b:
                opj_mutex_unlock(p_manager_mutex);
              }
            }
            else if (2 < (p_t1->mqc).end_of_byte_stream_counter) {
              if (p_manager_mutex != (opj_mutex_t *)0x0) {
                opj_mutex_lock(p_manager_mutex);
                opj_event_msg(p_manager,2,"PTERM check failure: %d synthetized 0xFF markers read\n",
                              (ulong)(p_t1->mqc).end_of_byte_stream_counter);
                goto LAB_0012b93b;
              }
              opj_event_msg(p_manager,2,"PTERM check failure: %d synthetized 0xFF markers read\n");
            }
          }
          if (cblk->decoded_data != (OPJ_INT32 *)0x0) {
            p_t1->data = local_58;
          }
          goto LAB_00129dbd;
        }
        if (p_manager_mutex == (opj_mutex_t *)0x0) {
          opj_event_msg(p_manager,2,"opj_t1_decode_cblk(): unsupported bpno_plus_one = %d >= 31\n",
                        (ulong)uVar35);
        }
        else {
          opj_mutex_lock(p_manager_mutex);
          opj_event_msg(p_manager,2,"opj_t1_decode_cblk(): unsupported bpno_plus_one = %d >= 31\n",
                        (ulong)uVar35);
          opj_mutex_unlock(p_manager_mutex);
        }
      }
    }
    else {
      OVar21 = opj_t1_ht_decode_cblk
                         (p_t1,cblk,piVar51[4],OVar49,uVar43,p_manager,p_manager_mutex,OVar21);
      if (OVar21 != 0) {
LAB_00129dbd:
        iVar32 = cblk->x0 - *piVar51;
        if ((piVar51[4] & 1U) != 0) {
          lVar29 = (ulong)(iVar5 - 1) * 0xc0;
          iVar32 = (iVar32 + *(int *)(*(long *)(lVar23 + 0x20) + 8 + lVar29)) -
                   *(int *)(*(long *)(lVar23 + 0x20) + lVar29);
        }
        iVar50 = cblk->y0 - piVar51[1];
        if ((piVar51[4] & 2U) != 0) {
          lVar29 = (ulong)(iVar5 - 1) * 0xc0;
          iVar50 = (iVar50 + *(int *)(*(long *)(lVar23 + 0x20) + 0xc + lVar29)) -
                   *(int *)(*(long *)(lVar23 + 0x20) + 4 + lVar29);
        }
        piVar61 = cblk->decoded_data;
        piVar41 = piVar61;
        if (piVar61 == (int *)0x0) {
          piVar41 = p_t1->data;
        }
        uVar43 = p_t1->w;
        uVar33 = (ulong)uVar43;
        uVar35 = p_t1->h;
        iVar5 = *(int *)(lVar52 + 0x328);
        if (iVar5 != 0) {
          if (iVar5 < 0x1f) {
            uVar42 = 0;
            for (uVar36 = 0; uVar36 != uVar35; uVar36 = uVar36 + 1) {
              iVar57 = (int)uVar42;
              uVar30 = uVar33;
              while (bVar64 = uVar30 != 0, uVar30 = uVar30 - 1, bVar64) {
                uVar28 = piVar41[uVar42];
                uVar27 = -uVar28;
                if (0 < (int)uVar28) {
                  uVar27 = uVar28;
                }
                if (uVar27 >> ((byte)iVar5 & 0x1f) != 0) {
                  uVar27 = uVar27 >> (*(byte *)(lVar52 + 0x328) & 0x1f);
                  uVar31 = -uVar27;
                  if (-1 < (int)uVar28) {
                    uVar31 = uVar27;
                  }
                  piVar41[uVar42] = uVar31;
                }
                uVar42 = (ulong)((int)uVar42 + 1);
              }
              uVar42 = (ulong)(iVar57 + uVar43);
            }
          }
          else {
            uVar36 = 0;
            for (uVar28 = 0; uVar42 = uVar33, uVar27 = uVar36, uVar28 != uVar35; uVar28 = uVar28 + 1
                ) {
              while( true ) {
                if (uVar42 == 0) break;
                piVar41[uVar27] = 0;
                uVar42 = uVar42 - 1;
                uVar27 = uVar27 + 1;
              }
              uVar36 = uVar36 + uVar43;
            }
          }
        }
        if (piVar61 == (int *)0x0) {
          lVar23 = *(long *)(lVar23 + 0x30);
          if (lVar23 == 0) {
            __assert_fail("(cblk->decoded_data != NULL) || (tilec->data != NULL)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/t1.c"
                          ,0x6de,"void opj_t1_clbl_decode_processor(void *, opj_tls_t *)");
          }
          if (*(int *)(lVar52 + 0x14) == 1) {
            piVar51 = (int *)(lVar23 + (long)iVar50 * (ulong)uVar40 * 4 + (long)iVar32 * 4);
            uVar30 = 0;
            for (uVar42 = 0; uVar42 != uVar35; uVar42 = uVar42 + 1) {
              uVar39 = uVar30 & 0xffffffff;
              piVar61 = piVar51;
              for (uVar63 = 0; uVar63 < (uVar43 & 0xfffffffc); uVar63 = uVar63 + 4) {
                iVar57 = (int)uVar30;
                iVar9 = (int)uVar63;
                iVar5 = piVar41[(uint)(iVar57 + 3 + iVar9)];
                iVar32 = piVar41[(uint)(iVar57 + 2 + iVar9)];
                iVar50 = piVar41[iVar57 + iVar9 + 1];
                piVar2 = piVar51 + uVar63;
                *piVar2 = piVar41[(uint)(iVar57 + iVar9)] / 2;
                piVar2[1] = iVar50 / 2;
                piVar2[2] = iVar32 / 2;
                piVar2[3] = iVar5 / 2;
                uVar39 = (ulong)((int)uVar39 + 4);
                piVar61 = piVar61 + 4;
              }
              for (; uVar63 < uVar33; uVar63 = uVar63 + 1) {
                *piVar61 = piVar41[uVar39] / 2;
                uVar39 = (ulong)((int)uVar39 + 1);
                piVar61 = piVar61 + 1;
              }
              uVar30 = uVar30 + uVar33;
              piVar51 = piVar51 + uVar40;
            }
          }
          else {
            fVar67 = (float)piVar51[10];
            lVar23 = lVar23 + (long)iVar50 * (ulong)uVar40 * 4 + (long)iVar32 * 4;
            for (uVar36 = 0; uVar36 != uVar35; uVar36 = uVar36 + 1) {
              for (lVar52 = 0; uVar43 != (uint)lVar52; lVar52 = lVar52 + 1) {
                *(float *)(lVar23 + lVar52 * 4) = (float)*piVar41 * fVar67 * 0.5;
                piVar41 = piVar41 + 1;
              }
              lVar23 = lVar23 + (ulong)uVar40 * 4;
            }
          }
        }
        else {
          uVar43 = uVar43 * uVar35;
          if (*(int *)(lVar52 + 0x14) == 1) {
            for (uVar33 = 0; uVar43 != uVar33; uVar33 = uVar33 + 1) {
              piVar41[uVar33] = piVar41[uVar33] / 2;
            }
          }
          else {
            fVar67 = (float)piVar51[10] * 0.5;
            for (lVar23 = 0; (uint)lVar23 < (uVar43 & 0xfffffff0); lVar23 = lVar23 + 0x10) {
              piVar51 = piVar41 + lVar23;
              iVar5 = piVar51[1];
              iVar32 = piVar51[2];
              iVar50 = piVar51[3];
              piVar61 = piVar41 + lVar23 + 4;
              iVar57 = *piVar61;
              iVar9 = piVar61[1];
              iVar10 = piVar61[2];
              iVar11 = piVar61[3];
              piVar61 = piVar41 + lVar23 + 8;
              iVar12 = *piVar61;
              iVar13 = piVar61[1];
              iVar14 = piVar61[2];
              iVar15 = piVar61[3];
              piVar61 = piVar41 + lVar23 + 0xc;
              iVar16 = *piVar61;
              iVar17 = piVar61[1];
              iVar18 = piVar61[2];
              iVar19 = piVar61[3];
              pfVar3 = (float *)(piVar41 + lVar23);
              *pfVar3 = (float)*piVar51 * fVar67;
              pfVar3[1] = (float)iVar5 * fVar67;
              pfVar3[2] = (float)iVar32 * fVar67;
              pfVar3[3] = (float)iVar50 * fVar67;
              pfVar3 = (float *)(piVar41 + lVar23 + 4);
              *pfVar3 = (float)iVar57 * fVar67;
              pfVar3[1] = (float)iVar9 * fVar67;
              pfVar3[2] = (float)iVar10 * fVar67;
              pfVar3[3] = (float)iVar11 * fVar67;
              pfVar3 = (float *)(piVar41 + lVar23 + 8);
              *pfVar3 = (float)iVar12 * fVar67;
              pfVar3[1] = (float)iVar13 * fVar67;
              pfVar3[2] = (float)iVar14 * fVar67;
              pfVar3[3] = (float)iVar15 * fVar67;
              pfVar3 = (float *)(piVar41 + lVar23 + 0xc);
              *pfVar3 = (float)iVar16 * fVar67;
              pfVar3[1] = (float)iVar17 * fVar67;
              pfVar3[2] = (float)iVar18 * fVar67;
              pfVar3[3] = (float)iVar19 * fVar67;
            }
            for (; (uint)lVar23 < uVar43; lVar23 = lVar23 + 1) {
              piVar41[lVar23] = (int)((float)piVar41[lVar23] * fVar67);
            }
          }
        }
        goto LAB_0012a2e0;
      }
    }
  }
LAB_0012a2d7:
  **(undefined4 **)((long)user_data + 0x30) = 0;
LAB_0012a2e0:
  opj_free(user_data);
  return;
}

Assistant:

static void opj_t1_clbl_decode_processor(void* user_data, opj_tls_t* tls)
{
    opj_tcd_cblk_dec_t* cblk;
    opj_tcd_band_t* band;
    opj_tcd_tilecomp_t* tilec;
    opj_tccp_t* tccp;
    OPJ_INT32* OPJ_RESTRICT datap;
    OPJ_UINT32 cblk_w, cblk_h;
    OPJ_INT32 x, y;
    OPJ_UINT32 i, j;
    opj_t1_cblk_decode_processing_job_t* job;
    opj_t1_t* t1;
    OPJ_UINT32 resno;
    OPJ_UINT32 tile_w;

    job = (opj_t1_cblk_decode_processing_job_t*) user_data;

    cblk = job->cblk;

    if (!job->whole_tile_decoding) {
        cblk_w = (OPJ_UINT32)(cblk->x1 - cblk->x0);
        cblk_h = (OPJ_UINT32)(cblk->y1 - cblk->y0);

        cblk->decoded_data = (OPJ_INT32*)opj_aligned_malloc(sizeof(OPJ_INT32) *
                             cblk_w * cblk_h);
        if (cblk->decoded_data == NULL) {
            if (job->p_manager_mutex) {
                opj_mutex_lock(job->p_manager_mutex);
            }
            opj_event_msg(job->p_manager, EVT_ERROR,
                          "Cannot allocate cblk->decoded_data\n");
            if (job->p_manager_mutex) {
                opj_mutex_unlock(job->p_manager_mutex);
            }
            *(job->pret) = OPJ_FALSE;
            opj_free(job);
            return;
        }
        /* Zero-init required */
        memset(cblk->decoded_data, 0, sizeof(OPJ_INT32) * cblk_w * cblk_h);
    } else if (cblk->decoded_data) {
        /* Not sure if that code path can happen, but better be */
        /* safe than sorry */
        opj_aligned_free(cblk->decoded_data);
        cblk->decoded_data = NULL;
    }

    resno = job->resno;
    band = job->band;
    tilec = job->tilec;
    tccp = job->tccp;
    tile_w = (OPJ_UINT32)(tilec->resolutions[tilec->minimum_num_resolutions - 1].x1
                          -
                          tilec->resolutions[tilec->minimum_num_resolutions - 1].x0);

    if (!*(job->pret)) {
        opj_free(job);
        return;
    }

    t1 = (opj_t1_t*) opj_tls_get(tls, OPJ_TLS_KEY_T1);
    if (t1 == NULL) {
        t1 = opj_t1_create(OPJ_FALSE);
        if (t1 == NULL) {
            opj_event_msg(job->p_manager, EVT_ERROR,
                          "Cannot allocate Tier 1 handle\n");
            *(job->pret) = OPJ_FALSE;
            opj_free(job);
            return;
        }
        if (!opj_tls_set(tls, OPJ_TLS_KEY_T1, t1, opj_t1_destroy_wrapper)) {
            opj_event_msg(job->p_manager, EVT_ERROR,
                          "Unable to set t1 handle as TLS\n");
            opj_t1_destroy(t1);
            *(job->pret) = OPJ_FALSE;
            opj_free(job);
            return;
        }
    }
    t1->mustuse_cblkdatabuffer = job->mustuse_cblkdatabuffer;

    if ((tccp->cblksty & J2K_CCP_CBLKSTY_HT) != 0) {
        if (OPJ_FALSE == opj_t1_ht_decode_cblk(
                    t1,
                    cblk,
                    band->bandno,
                    (OPJ_UINT32)tccp->roishift,
                    tccp->cblksty,
                    job->p_manager,
                    job->p_manager_mutex,
                    job->check_pterm)) {
            *(job->pret) = OPJ_FALSE;
            opj_free(job);
            return;
        }
    } else {
        if (OPJ_FALSE == opj_t1_decode_cblk(
                    t1,
                    cblk,
                    band->bandno,
                    (OPJ_UINT32)tccp->roishift,
                    tccp->cblksty,
                    job->p_manager,
                    job->p_manager_mutex,
                    job->check_pterm)) {
            *(job->pret) = OPJ_FALSE;
            opj_free(job);
            return;
        }
    }

    x = cblk->x0 - band->x0;
    y = cblk->y0 - band->y0;
    if (band->bandno & 1) {
        opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
        x += pres->x1 - pres->x0;
    }
    if (band->bandno & 2) {
        opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
        y += pres->y1 - pres->y0;
    }

    datap = cblk->decoded_data ? cblk->decoded_data : t1->data;
    cblk_w = t1->w;
    cblk_h = t1->h;

    if (tccp->roishift) {
        if (tccp->roishift >= 31) {
            for (j = 0; j < cblk_h; ++j) {
                for (i = 0; i < cblk_w; ++i) {
                    datap[(j * cblk_w) + i] = 0;
                }
            }
        } else {
            OPJ_INT32 thresh = 1 << tccp->roishift;
            for (j = 0; j < cblk_h; ++j) {
                for (i = 0; i < cblk_w; ++i) {
                    OPJ_INT32 val = datap[(j * cblk_w) + i];
                    OPJ_INT32 mag = abs(val);
                    if (mag >= thresh) {
                        mag >>= tccp->roishift;
                        datap[(j * cblk_w) + i] = val < 0 ? -mag : mag;
                    }
                }
            }
        }
    }

    /* Both can be non NULL if for example decoding a full tile and then */
    /* partially a tile. In which case partial decoding should be the */
    /* priority */
    assert((cblk->decoded_data != NULL) || (tilec->data != NULL));

    if (cblk->decoded_data) {
        OPJ_UINT32 cblk_size = cblk_w * cblk_h;
        if (tccp->qmfbid == 1) {
            for (i = 0; i < cblk_size; ++i) {
                datap[i] /= 2;
            }
        } else {        /* if (tccp->qmfbid == 0) */
            const float stepsize = 0.5f * band->stepsize;
            i = 0;
#ifdef __SSE2__
            {
                const __m128 xmm_stepsize = _mm_set1_ps(stepsize);
                for (; i < (cblk_size & ~15U); i += 16) {
                    __m128 xmm0_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 0)));
                    __m128 xmm1_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 4)));
                    __m128 xmm2_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 8)));
                    __m128 xmm3_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 12)));
                    _mm_store_ps((float*)(datap +  0), _mm_mul_ps(xmm0_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap +  4), _mm_mul_ps(xmm1_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap +  8), _mm_mul_ps(xmm2_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap + 12), _mm_mul_ps(xmm3_data, xmm_stepsize));
                    datap += 16;
                }
            }
#endif
            for (; i < cblk_size; ++i) {
                OPJ_FLOAT32 tmp = ((OPJ_FLOAT32)(*datap)) * stepsize;
                memcpy(datap, &tmp, sizeof(tmp));
                datap++;
            }
        }
    } else if (tccp->qmfbid == 1) {
        OPJ_INT32* OPJ_RESTRICT tiledp = &tilec->data[(OPJ_SIZE_T)y * tile_w +
                                                       (OPJ_SIZE_T)x];
        for (j = 0; j < cblk_h; ++j) {
            i = 0;
            for (; i < (cblk_w & ~(OPJ_UINT32)3U); i += 4U) {
                OPJ_INT32 tmp0 = datap[(j * cblk_w) + i + 0U];
                OPJ_INT32 tmp1 = datap[(j * cblk_w) + i + 1U];
                OPJ_INT32 tmp2 = datap[(j * cblk_w) + i + 2U];
                OPJ_INT32 tmp3 = datap[(j * cblk_w) + i + 3U];
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 0U] = tmp0 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 1U] = tmp1 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 2U] = tmp2 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 3U] = tmp3 / 2;
            }
            for (; i < cblk_w; ++i) {
                OPJ_INT32 tmp = datap[(j * cblk_w) + i];
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i] = tmp / 2;
            }
        }
    } else {        /* if (tccp->qmfbid == 0) */
        const float stepsize = 0.5f * band->stepsize;
        OPJ_FLOAT32* OPJ_RESTRICT tiledp = (OPJ_FLOAT32*) &tilec->data[(OPJ_SIZE_T)y *
                                                         tile_w + (OPJ_SIZE_T)x];
        for (j = 0; j < cblk_h; ++j) {
            OPJ_FLOAT32* OPJ_RESTRICT tiledp2 = tiledp;
            for (i = 0; i < cblk_w; ++i) {
                OPJ_FLOAT32 tmp = (OPJ_FLOAT32) * datap * stepsize;
                *tiledp2 = tmp;
                datap++;
                tiledp2++;
            }
            tiledp += tile_w;
        }
    }

    opj_free(job);
}